

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O2

void __thiscall Assimp::ASE::Mesh::Mesh(Mesh *this,Mesh *param_1)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  
  MeshWithSmoothingGroups<Assimp::ASE::Face>::MeshWithSmoothingGroups
            (&this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>,
             &param_1->super_MeshWithSmoothingGroups<Assimp::ASE::Face>);
  BaseNode::BaseNode(&this->super_BaseNode,&param_1->super_BaseNode);
  lVar6 = 0;
  do {
    *(undefined8 *)
     ((long)&this->amTexCoords[0].
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start + lVar6) =
         *(undefined8 *)
          ((long)&param_1->amTexCoords[0].
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start + lVar6);
    *(undefined8 *)
     ((long)&this->amTexCoords[0].
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar6) =
         *(undefined8 *)
          ((long)&param_1->amTexCoords[0].
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish + lVar6);
    *(undefined8 *)
     ((long)&this->amTexCoords[0].
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar6) =
         *(undefined8 *)
          ((long)&param_1->amTexCoords[0].
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage + lVar6);
    *(undefined8 *)
     ((long)&param_1->amTexCoords[0].
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar6) = 0;
    puVar1 = (undefined8 *)
             ((long)&param_1->amTexCoords[0].
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar6);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0xc0);
  (this->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->mVertexColors).
       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->mVertexColors).
       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->mVertexColors).
       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mBoneVertices).
  super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->mBoneVertices).
       super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->mBoneVertices).
  super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->mBoneVertices).
       super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (this->mBoneVertices).
  super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->mBoneVertices).
       super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (param_1->mBoneVertices).
  super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mBoneVertices).
  super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->mBoneVertices).
  super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mBones).super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->mBones).super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->mBones).super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->mBones).super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->mBones).super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->mBones).super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->mBones).super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->mBones).super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mBones).super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)((long)this->mNumUVComponents + 0x19) =
       *(undefined8 *)((long)param_1->mNumUVComponents + 0x19);
  uVar4 = param_1->iMaterialIndex;
  uVar5 = param_1->mNumUVComponents[0];
  uVar2 = *(undefined8 *)(param_1->mNumUVComponents + 1);
  uVar3 = *(undefined8 *)(param_1->mNumUVComponents + 5);
  *(undefined8 *)(this->mNumUVComponents + 3) = *(undefined8 *)(param_1->mNumUVComponents + 3);
  *(undefined8 *)(this->mNumUVComponents + 5) = uVar3;
  this->iMaterialIndex = uVar4;
  this->mNumUVComponents[0] = uVar5;
  *(undefined8 *)(this->mNumUVComponents + 1) = uVar2;
  return;
}

Assistant:

Mesh() = delete;